

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O0

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(int32_t termLength)

{
  bool bVar1;
  IllegalStateException *pIVar2;
  char *pcVar3;
  int in_EDI;
  char *in_stack_fffffffffffffd28;
  allocator *filename;
  char *in_stack_fffffffffffffd30;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  string local_b8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  int local_4;
  
  local_4 = in_EDI;
  if (in_EDI < 0x10000) {
    local_102 = 1;
    pIVar2 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_88,0x10000);
    std::operator+(&local_68,"term length less than min size of ",&local_88);
    std::operator+(&local_48,&local_68,", length=");
    std::__cxx11::to_string(&local_b8,local_4);
    std::operator+(&local_28,&local_48,&local_b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,&local_d9);
    pcVar3 = util::past_prefix(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,pcVar3,&local_101);
    util::IllegalStateException::IllegalStateException(pIVar2,&local_28,&local_d8,&local_100,0x9c);
    local_102 = 0;
    __cxa_throw(pIVar2,&util::IllegalStateException::typeinfo,
                util::IllegalStateException::~IllegalStateException);
  }
  if (0x40000000 < in_EDI) {
    local_1f2 = 1;
    pIVar2 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_188,0x40000000);
    std::operator+(&local_168,"term length greater than max size of ",&local_188);
    std::operator+(&local_148,&local_168,", length=");
    std::__cxx11::to_string(&local_1a8,local_4);
    std::operator+(&local_128,&local_148,&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,&local_1c9);
    pcVar3 = util::past_prefix(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,pcVar3,&local_1f1);
    util::IllegalStateException::IllegalStateException(pIVar2,&local_128,&local_1c8,&local_1f0,0xa3)
    ;
    local_1f2 = 0;
    __cxa_throw(pIVar2,&util::IllegalStateException::typeinfo,
                util::IllegalStateException::~IllegalStateException);
  }
  bVar1 = util::BitUtil::isPowerOfTwo<int>(in_EDI);
  if (!bVar1) {
    pIVar2 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_238,local_4);
    std::operator+(&local_218,"term length not a power of 2, length=",&local_238);
    filename = &local_259;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_258,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkTermLength(std::int32_t)"
               ,filename);
    pcVar3 = util::past_prefix((char *)pIVar2,(char *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,pcVar3,&local_281);
    util::IllegalStateException::IllegalStateException(pIVar2,&local_218,&local_258,&local_280,0xa9)
    ;
    __cxa_throw(pIVar2,&util::IllegalStateException::typeinfo,
                util::IllegalStateException::~IllegalStateException);
  }
  return;
}

Assistant:

inline void checkTermLength(std::int32_t termLength)
{
    if (termLength < TERM_MIN_LENGTH)
    {
        throw util::IllegalStateException(
            "term length less than min size of " + std::to_string(TERM_MIN_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (termLength > TERM_MAX_LENGTH)
    {
        throw util::IllegalStateException(
            "term length greater than max size of " + std::to_string(TERM_MAX_LENGTH) +
            ", length=" + std::to_string(termLength), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(termLength))
    {
        throw util::IllegalStateException(
            "term length not a power of 2, length=" + std::to_string(termLength), SOURCEINFO);
    }
}